

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

void __thiscall
absl::
InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
::pop_back(InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
           *this)

{
  undefined8 *puVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = (this->allocator_and_tag_).tag_.size_;
  if (1 < uVar2) {
    uVar4 = uVar2 >> 1;
    if ((uVar2 & 1) == 0) {
      (&this->allocator_and_tag_)[uVar4 * 3].tag_.size_ = 0xabababababababab;
      puVar1 = (undefined8 *)((long)this + uVar4 * 0x18 + -0x10);
      *puVar1 = 0xabababababababab;
      puVar1[1] = 0xabababababababab;
    }
    else {
      lVar3 = *(long *)((long)&this->rep_ + 8);
      *(undefined8 *)(lVar3 + -8 + uVar4 * 0x18) = 0xabababababababab;
      puVar1 = (undefined8 *)(lVar3 + -0x18 + uVar4 * 0x18);
      *puVar1 = 0xabababababababab;
      puVar1[1] = 0xabababababababab;
    }
    (this->allocator_and_tag_).tag_.size_ = uVar2 - 2;
    return;
  }
  __assert_fail("!empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x238,
                "void absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry, 16>::pop_back() [T = S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry, N = 16, A = std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>]"
               );
}

Assistant:

size_type size() const { return size_ / 2; }